

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mesh * rf_gen_mesh_sphere(rf_mesh *__return_storage_ptr__,float radius,int rings,int slices,
                            rf_allocator allocator,rf_allocator temp_allocator)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  uint16_t *puVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  uint uVar10;
  long lVar11;
  rf_source_location rVar12;
  rf_source_location rVar13;
  rf_source_location rVar14;
  rf_source_location rVar15;
  rf_allocator_args rVar16;
  undefined1 auVar17 [24];
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  uint *puVar20;
  par_shapes_mesh *mesh;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long *in_FS_OFFSET;
  float mintriarea;
  uint uStack_ec;
  uint uStack_bc;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_40.allocator_proc = allocator.allocator_proc;
  local_40.user_data = allocator.user_data;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->vbo_id = (uint *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->texcoords = (float *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->vertex_count = 0;
  __return_storage_ptr__->triangle_count = 0;
  __return_storage_ptr__->vertices = (float *)0x0;
  rVar12.proc_name = "rf_gen_mesh_sphere";
  rVar12.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar12.line_in_file = 0x881c;
  rVar16._16_8_ = (ulong)uStack_5c << 0x20;
  rVar16.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar16.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar20 = (uint *)(*local_40.allocator_proc)(&local_40,rVar12,RF_AM_ALLOC,rVar16);
  __return_storage_ptr__->vbo_id = puVar20;
  puVar20[0] = 0;
  puVar20[1] = 0;
  puVar20[2] = 0;
  puVar20[3] = 0;
  puVar20[3] = 0;
  puVar20[4] = 0;
  puVar20[5] = 0;
  puVar20[6] = 0;
  lVar3 = *in_FS_OFFSET;
  in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
  in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
  if (rings < 3 || slices < 3) {
    mesh = (par_shapes_mesh *)0x0;
  }
  else {
    mesh = par_shapes_create_parametric(par_shapes__sphere,slices,rings,(void *)0x0);
    par_shapes_remove_degenerate(mesh,mintriarea);
  }
  par_shapes_scale(mesh,radius,radius,radius);
  rVar13.proc_name = "rf_gen_mesh_sphere";
  rVar13.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar13.line_in_file = 0x8825;
  auVar17._8_8_ = (ulong)uStack_8c << 0x20;
  auVar17._0_8_ = (long)(mesh->ntriangles * 9) << 2;
  auVar17._16_8_ = 0;
  pfVar21 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar13,RF_AM_ALLOC,(rf_allocator_args)(auVar17 << 0x40));
  __return_storage_ptr__->vertices = pfVar21;
  rVar14.proc_name = "rf_gen_mesh_sphere";
  rVar14.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar14.line_in_file = 0x8826;
  auVar18._8_8_ = (ulong)uStack_bc << 0x20;
  auVar18._0_8_ = (long)(mesh->ntriangles * 6) << 2;
  auVar18._16_8_ = 0;
  pfVar21 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar14,RF_AM_ALLOC,(rf_allocator_args)(auVar18 << 0x40));
  __return_storage_ptr__->texcoords = pfVar21;
  rVar15.proc_name = "rf_gen_mesh_sphere";
  rVar15.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar15.line_in_file = 0x8827;
  auVar19._8_8_ = (ulong)uStack_ec << 0x20;
  auVar19._0_8_ = (long)(mesh->ntriangles * 9) << 2;
  auVar19._16_8_ = 0;
  pfVar21 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar15,RF_AM_ALLOC,(rf_allocator_args)(auVar19 << 0x40));
  __return_storage_ptr__->normals = pfVar21;
  iVar2 = mesh->ntriangles;
  uVar10 = iVar2 * 3;
  __return_storage_ptr__->vertex_count = uVar10;
  __return_storage_ptr__->triangle_count = iVar2;
  if (0 < iVar2) {
    pfVar4 = mesh->points;
    puVar5 = mesh->triangles;
    pfVar6 = __return_storage_ptr__->vertices;
    pfVar7 = __return_storage_ptr__->texcoords;
    pfVar8 = mesh->normals;
    pfVar9 = mesh->tcoords;
    uVar22 = 1;
    if (1 < (int)uVar10) {
      uVar22 = (ulong)uVar10;
    }
    lVar23 = 2;
    uVar24 = 0;
    do {
      uVar1 = puVar5[uVar24];
      lVar11 = (ulong)((uint)uVar1 * 4) * 3;
      pfVar6[lVar23 + -2] = *(float *)((long)pfVar4 + lVar11);
      pfVar6[lVar23 + -1] = *(float *)((long)pfVar4 + lVar11 + 4);
      pfVar6[lVar23] = *(float *)((long)pfVar4 + lVar11 + 8);
      pfVar21[lVar23 + -2] = *(float *)((long)pfVar8 + lVar11);
      pfVar21[lVar23 + -1] = *(float *)((long)pfVar8 + lVar11 + 4);
      pfVar21[lVar23] = *(float *)((long)pfVar8 + lVar11 + 8);
      pfVar7[uVar24 * 2] = pfVar9[(ulong)uVar1 * 2];
      pfVar7[uVar24 * 2 + 1] = pfVar9[(ulong)uVar1 * 2 + 1];
      uVar24 = uVar24 + 1;
      lVar23 = lVar23 + 3;
    } while (uVar22 != uVar24);
  }
  par_shapes_free_mesh(mesh);
  *(undefined8 *)(lVar3 + -0x430) = 0;
  *(undefined8 *)(lVar3 + -0x428) = 0;
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_sphere(float radius, int rings, int slices, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        par_shapes_mesh* sphere = par_shapes_create_parametric_sphere(slices, rings);
        par_shapes_scale(sphere, radius, radius, radius);
        // NOTE: Soft normals are computed internally

        mesh.vertices  = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));
        mesh.texcoords = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 2 * sizeof(float));
        mesh.normals   = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));

        mesh.vertex_count = sphere->ntriangles * 3;
        mesh.triangle_count = sphere->ntriangles;

        for (rf_int k = 0; k < mesh.vertex_count; k++)
        {
            mesh.vertices[k * 3    ] = sphere->points[sphere->triangles[k] * 3];
            mesh.vertices[k * 3 + 1] = sphere->points[sphere->triangles[k] * 3 + 1];
            mesh.vertices[k * 3 + 2] = sphere->points[sphere->triangles[k] * 3 + 2];

            mesh.normals[k * 3    ] = sphere->normals[sphere->triangles[k] * 3];
            mesh.normals[k * 3 + 1] = sphere->normals[sphere->triangles[k] * 3 + 1];
            mesh.normals[k * 3 + 2] = sphere->normals[sphere->triangles[k] * 3 + 2];

            mesh.texcoords[k * 2    ] = sphere->tcoords[sphere->triangles[k] * 2];
            mesh.texcoords[k * 2 + 1] = sphere->tcoords[sphere->triangles[k] * 2 + 1];
        }

        par_shapes_free_mesh(sphere);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}